

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall
mocker::ir::Builder::operator()::anon_class_16_2_3f94c575::operator()
          (anon_class_16_2_3f94c575 *this)

{
  Builder *pBVar1;
  bool bVar2;
  anon_class_16_2_3f94c575 *this_local;
  
  pBVar1 = this->this;
  bVar2 = BuilderContext::isTrivial(pBVar1->ctx,&this->node->lhs);
  if (bVar2) {
    BuilderContext::markExprTrivial(pBVar1->ctx,&this->node->super_Expression);
  }
  return;
}

Assistant:

void Builder::operator()(const ast::UnaryExpr &node) const {
  Defer defer([&node, this] {
    if (ctx.isTrivial(node.operand))
      ctx.markExprTrivial(node);
  });

  // arithmetic
  if (node.op == ast::UnaryExpr::BitNot || node.op == ast::UnaryExpr::Neg) {
    auto bak = ctx.getLogicalExprInfo().empty;
    ctx.getLogicalExprInfo().empty = true;
    visit(*node.operand);
    ctx.getLogicalExprInfo().empty = bak;
    ArithUnaryInst::OpType op =
        (node.op == ast::UnaryExpr::BitNot ? ArithUnaryInst::OpType::BitNot
                                           : ArithUnaryInst::OpType::Neg);
    auto dest = ctx.makeTempLocalReg();
    ctx.setExprAddr(node.getID(), dest);
    auto operand = ctx.getExprAddr(node.operand->getID());
    ctx.emplaceInst<ArithUnaryInst>(dest, op, operand);
    return;
  }
  if (node.op == ast::UnaryExpr::PreInc || node.op == ast::UnaryExpr::PostInc ||
      node.op == ast::UnaryExpr::PreDec || node.op == ast::UnaryExpr::PostDec) {
    ArithBinaryInst::OpType op =
        (node.op == ast::UnaryExpr::PreInc || node.op == ast::UnaryExpr::PostInc
             ? ArithBinaryInst::OpType::Add
             : ArithBinaryInst::OpType::Sub);
    bool isPre =
        node.op == ast::UnaryExpr::PreInc || node.op == ast::UnaryExpr::PreDec;

    auto bak = ctx.getLogicalExprInfo().empty;
    ctx.getLogicalExprInfo().empty = true;
    auto addr = getElementPtr(node.operand);
    ctx.getLogicalExprInfo().empty = bak;
    auto oldVal = ctx.makeTempLocalReg();
    ctx.emplaceInst<Load>(oldVal, addr);

    auto newVal = ctx.makeTempLocalReg();
    auto lit1 = std::make_shared<IntLiteral>((Integer)1);
    ctx.emplaceInst<ArithBinaryInst>(newVal, op, oldVal, lit1);

    ctx.setExprAddr(node.getID(), isPre ? newVal : oldVal);
    ctx.emplaceInst<Store>(addr, newVal);

    return;
  }

  assert(node.op == ast::UnaryExpr::LogicalNot);
  if (!ctx.getLogicalExprInfo().empty)
    std::swap(ctx.getLogicalExprInfo().trueNext,
              ctx.getLogicalExprInfo().falseNext);
  visit(*node.operand);
  auto dest = ctx.makeTempLocalReg();
  ctx.setExprAddr(node.getID(), dest);
  if (ctx.getLogicalExprInfo().empty) {
    auto operand = ctx.getExprAddr(node.operand->getID());
    ctx.emplaceInst<ArithBinaryInst>(dest, ArithBinaryInst::Xor, operand,
                                     std::make_shared<IntLiteral>(1));
  }
}